

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-vfp-uncond.inc.c
# Opt level: O0

_Bool disas_vfp_uncond(DisasContext_conflict1 *ctx,uint32_t insn)

{
  _Bool _Var1;
  uint uVar2;
  undefined1 local_30 [8];
  anon_union_20_4_fa272343 u;
  uint32_t insn_local;
  DisasContext_conflict1 *ctx_local;
  
  uVar2 = insn & 0xff800f50;
  u.f_disas_vfp_uncond1.vm = insn;
  unique0x100002c0 = ctx;
  if (uVar2 == 0xfe000a00) {
    disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_2(ctx,(arg_disas_vfp_uncond1 *)local_30,insn);
    _Var1 = trans_VSEL(stack0xffffffffffffffe8,(arg_VSEL *)local_30);
    if (_Var1) {
      ctx_local._7_1_ = true;
    }
    else {
      ctx_local._7_1_ = false;
    }
  }
  else if (uVar2 == 0xfe000b00) {
    disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_3(ctx,(arg_disas_vfp_uncond1 *)local_30,insn);
    _Var1 = trans_VSEL(stack0xffffffffffffffe8,(arg_VSEL *)local_30);
    if (_Var1) {
      ctx_local._7_1_ = true;
    }
    else {
      ctx_local._7_1_ = false;
    }
  }
  else if (uVar2 == 0xfe800a00) {
    disas_vfp_uncond_extract_vfp_dnm_s(ctx,(arg_disas_vfp_uncond0 *)local_30,insn);
    if (((uint)u.f_disas_vfp_uncond1.vm >> 0x14 & 3) == 0) {
      _Var1 = trans_VMAXNM_sp(stack0xffffffffffffffe8,(arg_VMAXNM_sp *)local_30);
      if (_Var1) {
        ctx_local._7_1_ = true;
      }
      else {
        ctx_local._7_1_ = false;
      }
    }
    else {
      ctx_local._7_1_ = false;
    }
  }
  else if (uVar2 == 0xfe800a40) {
    uVar2 = insn >> 0x14 & 3;
    if (uVar2 == 0) {
      disas_vfp_uncond_extract_vfp_dnm_s(ctx,(arg_disas_vfp_uncond0 *)local_30,insn);
      _Var1 = trans_VMINNM_sp(stack0xffffffffffffffe8,(arg_VMINNM_sp *)local_30);
      if (_Var1) {
        ctx_local._7_1_ = true;
      }
      else {
        ctx_local._7_1_ = false;
      }
    }
    else if (uVar2 == 3) {
      uVar2 = insn >> 0x12 & 3;
      if (uVar2 == 2) {
        disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_4(ctx,(arg_disas_vfp_uncond2 *)local_30,insn);
        if ((u.f_disas_vfp_uncond1.vm & 0x80U) == 0) {
          _Var1 = trans_VRINT(stack0xffffffffffffffe8,(arg_VRINT *)local_30);
          if (_Var1) {
            ctx_local._7_1_ = true;
          }
          else {
            ctx_local._7_1_ = false;
          }
        }
        else {
          ctx_local._7_1_ = false;
        }
      }
      else if (uVar2 == 3) {
        disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_6(ctx,(arg_disas_vfp_uncond3 *)local_30,insn);
        _Var1 = trans_VCVT(stack0xffffffffffffffe8,(arg_VCVT *)local_30);
        if (_Var1) {
          ctx_local._7_1_ = true;
        }
        else {
          ctx_local._7_1_ = false;
        }
      }
      else {
        ctx_local._7_1_ = false;
      }
    }
    else {
      ctx_local._7_1_ = false;
    }
  }
  else if (uVar2 == 0xfe800b00) {
    disas_vfp_uncond_extract_vfp_dnm_d(ctx,(arg_disas_vfp_uncond0 *)local_30,insn);
    if (((uint)u.f_disas_vfp_uncond1.vm >> 0x14 & 3) == 0) {
      _Var1 = trans_VMAXNM_dp(stack0xffffffffffffffe8,(arg_VMAXNM_dp *)local_30);
      if (_Var1) {
        ctx_local._7_1_ = true;
      }
      else {
        ctx_local._7_1_ = false;
      }
    }
    else {
      ctx_local._7_1_ = false;
    }
  }
  else if (uVar2 == 0xfe800b40) {
    uVar2 = insn >> 0x14 & 3;
    if (uVar2 == 0) {
      disas_vfp_uncond_extract_vfp_dnm_d(ctx,(arg_disas_vfp_uncond0 *)local_30,insn);
      _Var1 = trans_VMINNM_dp(stack0xffffffffffffffe8,(arg_VMINNM_dp *)local_30);
      if (_Var1) {
        ctx_local._7_1_ = true;
      }
      else {
        ctx_local._7_1_ = false;
      }
    }
    else if (uVar2 == 3) {
      uVar2 = insn >> 0x12 & 3;
      if (uVar2 == 2) {
        disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_5(ctx,(arg_disas_vfp_uncond2 *)local_30,insn);
        if ((u.f_disas_vfp_uncond1.vm & 0x80U) == 0) {
          _Var1 = trans_VRINT(stack0xffffffffffffffe8,(arg_VRINT *)local_30);
          if (_Var1) {
            ctx_local._7_1_ = true;
          }
          else {
            ctx_local._7_1_ = false;
          }
        }
        else {
          ctx_local._7_1_ = false;
        }
      }
      else if (uVar2 == 3) {
        disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_7(ctx,(arg_disas_vfp_uncond3 *)local_30,insn);
        _Var1 = trans_VCVT(stack0xffffffffffffffe8,(arg_VCVT *)local_30);
        if (_Var1) {
          ctx_local._7_1_ = true;
        }
        else {
          ctx_local._7_1_ = false;
        }
      }
      else {
        ctx_local._7_1_ = false;
      }
    }
    else {
      ctx_local._7_1_ = false;
    }
  }
  else {
    ctx_local._7_1_ = false;
  }
  return ctx_local._7_1_;
}

Assistant:

static bool disas_vfp_uncond(DisasContext *ctx, uint32_t insn)
{
    union {
        arg_disas_vfp_uncond0 f_disas_vfp_uncond0;
        arg_disas_vfp_uncond1 f_disas_vfp_uncond1;
        arg_disas_vfp_uncond2 f_disas_vfp_uncond2;
        arg_disas_vfp_uncond3 f_disas_vfp_uncond3;
    } u;

    switch (insn & 0xff800f50) {
    case 0xfe000a00:
        /* 11111110 0....... ....1010 .0.0.... */
        /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:47 */
        disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_2(ctx, &u.f_disas_vfp_uncond1, insn);
        if (trans_VSEL(ctx, &u.f_disas_vfp_uncond1)) return true;
        return false;
    case 0xfe000b00:
        /* 11111110 0....... ....1011 .0.0.... */
        /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:49 */
        disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_3(ctx, &u.f_disas_vfp_uncond1, insn);
        if (trans_VSEL(ctx, &u.f_disas_vfp_uncond1)) return true;
        return false;
    case 0xfe800a00:
        /* 11111110 1....... ....1010 .0.0.... */
        disas_vfp_uncond_extract_vfp_dnm_s(ctx, &u.f_disas_vfp_uncond0, insn);
        switch ((insn >> 20) & 0x3) {
        case 0x0:
            /* 11111110 1.00.... ....1010 .0.0.... */
            /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:52 */
            if (trans_VMAXNM_sp(ctx, &u.f_disas_vfp_uncond0)) return true;
            return false;
        }
        return false;
    case 0xfe800a40:
        /* 11111110 1....... ....1010 .1.0.... */
        switch ((insn >> 20) & 0x3) {
        case 0x0:
            /* 11111110 1.00.... ....1010 .1.0.... */
            /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:53 */
            disas_vfp_uncond_extract_vfp_dnm_s(ctx, &u.f_disas_vfp_uncond0, insn);
            if (trans_VMINNM_sp(ctx, &u.f_disas_vfp_uncond0)) return true;
            return false;
        case 0x3:
            /* 11111110 1.11.... ....1010 .1.0.... */
            switch ((insn >> 18) & 0x3) {
            case 0x2:
                /* 11111110 1.1110.. ....1010 .1.0.... */
                disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_4(ctx, &u.f_disas_vfp_uncond2, insn);
                switch ((insn >> 7) & 0x1) {
                case 0x0:
                    /* 11111110 1.1110.. ....1010 01.0.... */
                    /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:58 */
                    if (trans_VRINT(ctx, &u.f_disas_vfp_uncond2)) return true;
                    return false;
                }
                return false;
            case 0x3:
                /* 11111110 1.1111.. ....1010 .1.0.... */
                /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:64 */
                disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_6(ctx, &u.f_disas_vfp_uncond3, insn);
                if (trans_VCVT(ctx, &u.f_disas_vfp_uncond3)) return true;
                return false;
            }
            return false;
        }
        return false;
    case 0xfe800b00:
        /* 11111110 1....... ....1011 .0.0.... */
        disas_vfp_uncond_extract_vfp_dnm_d(ctx, &u.f_disas_vfp_uncond0, insn);
        switch ((insn >> 20) & 0x3) {
        case 0x0:
            /* 11111110 1.00.... ....1011 .0.0.... */
            /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:55 */
            if (trans_VMAXNM_dp(ctx, &u.f_disas_vfp_uncond0)) return true;
            return false;
        }
        return false;
    case 0xfe800b40:
        /* 11111110 1....... ....1011 .1.0.... */
        switch ((insn >> 20) & 0x3) {
        case 0x0:
            /* 11111110 1.00.... ....1011 .1.0.... */
            /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:56 */
            disas_vfp_uncond_extract_vfp_dnm_d(ctx, &u.f_disas_vfp_uncond0, insn);
            if (trans_VMINNM_dp(ctx, &u.f_disas_vfp_uncond0)) return true;
            return false;
        case 0x3:
            /* 11111110 1.11.... ....1011 .1.0.... */
            switch ((insn >> 18) & 0x3) {
            case 0x2:
                /* 11111110 1.1110.. ....1011 .1.0.... */
                disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_5(ctx, &u.f_disas_vfp_uncond2, insn);
                switch ((insn >> 7) & 0x1) {
                case 0x0:
                    /* 11111110 1.1110.. ....1011 01.0.... */
                    /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:60 */
                    if (trans_VRINT(ctx, &u.f_disas_vfp_uncond2)) return true;
                    return false;
                }
                return false;
            case 0x3:
                /* 11111110 1.1111.. ....1011 .1.0.... */
                /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:66 */
                disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_7(ctx, &u.f_disas_vfp_uncond3, insn);
                if (trans_VCVT(ctx, &u.f_disas_vfp_uncond3)) return true;
                return false;
            }
            return false;
        }
        return false;
    }
    return false;
}